

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int ImGui::FindWindowDisplayIndex(ImGuiWindow *window)

{
  int iVar1;
  ImVector<ImGuiWindow_*> *this;
  ImGuiWindow **it;
  ImGuiContext *g;
  ImGuiWindow *window_local;
  
  this = &GImGui->Windows;
  g = (ImGuiContext *)window;
  it = ImVector<ImGuiWindow_*>::find(&GImGui->Windows,(ImGuiWindow **)&g);
  iVar1 = ImVector<ImGuiWindow_*>::index_from_ptr(this,it);
  return iVar1;
}

Assistant:

int ImGui::FindWindowDisplayIndex(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    return g.Windows.index_from_ptr(g.Windows.find(window));
}